

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O0

void __thiscall
PrimitiveDisplayer::drawableWithGLRotation
          (PrimitiveDisplayer *this,Drawable *drawable,float rotation,Vec2d *coords)

{
  bool bVar1;
  Vec2d *pVVar2;
  vector<Quad_*,_std::allocator<Quad_*>_> *this_00;
  reference ppQVar3;
  Quad *quad;
  iterator __end1;
  iterator __begin1;
  vector<Quad_*,_std::allocator<Quad_*>_> *__range1;
  Vec2d *pivotPoint;
  Vec2d *coords_local;
  float rotation_local;
  Drawable *drawable_local;
  PrimitiveDisplayer *this_local;
  
  pVVar2 = (Vec2d *)(**(code **)(*(long *)(&drawable->field_0x0 + *(long *)((long)*drawable + -0x50)
                                          ) + 0x30))
                              (&drawable->field_0x0 + *(long *)((long)*drawable + -0x50));
  pVVar2 = Vec2d::getScale(pVVar2,this->pixelsPerSquare);
  glPushMatrix();
  Vec2d::getX(coords);
  Vec2d::getY(coords);
  glTranslatef();
  Vec2d::getX(pVVar2);
  Vec2d::getY(pVVar2);
  glTranslatef();
  glRotatef();
  Vec2d::getX(pVVar2);
  Vec2d::getY(pVVar2);
  glTranslatef();
  this_00 = (vector<Quad_*,_std::allocator<Quad_*>_> *)(**(code **)((long)*drawable + 0x40))();
  __end1 = std::vector<Quad_*,_std::allocator<Quad_*>_>::begin(this_00);
  quad = (Quad *)std::vector<Quad_*,_std::allocator<Quad_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>
                                *)&quad);
    if (!bVar1) break;
    ppQVar3 = __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::
              operator*(&__end1);
    drawQuad(this,*ppQVar3);
    __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::operator++
              (&__end1);
  }
  glPopMatrix();
  if (pVVar2 != (Vec2d *)0x0) {
    operator_delete(pVVar2);
  }
  return;
}

Assistant:

void PrimitiveDisplayer::drawableWithGLRotation(Drawable* drawable, float rotation, Vec2d* coords) {
    Vec2d* pivotPoint = drawable->getPivotPoint()->getScale(pixelsPerSquare);
    
    glPushMatrix();
    // move to object coords - invert the y coordinate
    glTranslatef(coords->getX() * pixelsPerSquare, (20 - coords->getY()) * pixelsPerSquare, 0.f);
    
    // perform the rotation by moving to the pivot point (again inverting y), rotating, then moving back.
    glTranslatef(pivotPoint->getX(), -pivotPoint->getY(), 0.f);
    glRotatef(rotation, 0.f, 0.f, 1.f);
    glTranslatef(-pivotPoint->getX(), pivotPoint->getY(), 0.f);
    
    // draw the quads with no rotation
    for (auto quad : *drawable->getQuads()) {
        drawQuad(quad);
    }
    glPopMatrix();
    
    delete pivotPoint;
    pivotPoint = nullptr;
    coords = nullptr;
}